

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  PathDeclarationSyntax *args_2;
  IfNonePathDeclarationSyntax *pIVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000078;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000080;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  BumpAllocator *in_stack_ffffffffffffffc8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  args_2 = (PathDeclarationSyntax *)
           deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000080,in_stack_00000078);
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  not_null<slang::syntax::PathDeclarationSyntax_*>::operator*
            ((not_null<slang::syntax::PathDeclarationSyntax_*> *)0x28399b);
  deepClone<slang::syntax::PathDeclarationSyntax>
            ((PathDeclarationSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  pIVar1 = BumpAllocator::
           emplace<slang::syntax::IfNonePathDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::PathDeclarationSyntax&>
                     (this,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar2.info,
                      TVar2._0_8_,args_2);
  return (int)pIVar1;
}

Assistant:

static SyntaxNode* clone(const IfNonePathDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<IfNonePathDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        *deepClone<PathDeclarationSyntax>(*node.path, alloc)
    );
}